

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

bool __thiscall stick::URI::isEmpty(URI *this)

{
  bool bVar1;
  bool local_11;
  URI *this_local;
  
  bVar1 = String::isEmpty(&this->m_scheme);
  local_11 = false;
  if (bVar1) {
    bVar1 = String::isEmpty(&this->m_host);
    local_11 = false;
    if (bVar1) {
      bVar1 = String::isEmpty(&this->m_path);
      local_11 = false;
      if (bVar1) {
        bVar1 = String::isEmpty(&this->m_query);
        local_11 = false;
        if (bVar1) {
          local_11 = String::isEmpty(&this->m_fragment);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool URI::isEmpty() const
{
    return m_scheme.isEmpty() && m_host.isEmpty() && m_path.isEmpty() && m_query.isEmpty() &&
           m_fragment.isEmpty();
}